

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O3

DecimalFormatSymbols * __thiscall
icu_63::RuleBasedNumberFormat::initializeDecimalFormatSymbols
          (RuleBasedNumberFormat *this,UErrorCode *status)

{
  DecimalFormatSymbols *this_00;
  
  if (this->decimalFormatSymbols == (DecimalFormatSymbols *)0x0) {
    this_00 = (DecimalFormatSymbols *)UMemory::operator_new((UMemory *)0xb00,(size_t)status);
    if (this_00 == (DecimalFormatSymbols *)0x0) {
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        *status = U_MEMORY_ALLOCATION_ERROR;
      }
    }
    else {
      DecimalFormatSymbols::DecimalFormatSymbols(this_00,&this->locale,status);
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        this->decimalFormatSymbols = this_00;
      }
      else {
        (*(this_00->super_UObject)._vptr_UObject[1])(this_00);
      }
    }
  }
  return this->decimalFormatSymbols;
}

Assistant:

DecimalFormatSymbols*
RuleBasedNumberFormat::initializeDecimalFormatSymbols(UErrorCode &status)
{
    // lazy-evaluate the DecimalFormatSymbols object.  This object
    // is shared by all DecimalFormat instances belonging to this
    // formatter
    if (decimalFormatSymbols == nullptr) {
        LocalPointer<DecimalFormatSymbols> temp(new DecimalFormatSymbols(locale, status), status);
        if (U_SUCCESS(status)) {
            decimalFormatSymbols = temp.orphan();
        }
    }
    return decimalFormatSymbols;
}